

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

double * cheby_t_poly_coef(int n)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int local_28;
  int local_24;
  int j;
  int i;
  double *c;
  double *pdStack_10;
  int n_local;
  
  if (n < 0) {
    pdStack_10 = (double *)0x0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)((n + 1) * (n + 1));
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pdStack_10 = (double *)operator_new__(uVar2);
    for (local_24 = 0; local_24 <= n; local_24 = local_24 + 1) {
      for (local_28 = 0; local_28 <= n; local_28 = local_28 + 1) {
        pdStack_10[local_24 + local_28 * (n + 1)] = 0.0;
      }
    }
    *pdStack_10 = 1.0;
    if (n != 0) {
      pdStack_10[n + 2] = 1.0;
      for (local_24 = 2; local_24 <= n; local_24 = local_24 + 1) {
        pdStack_10[local_24] = -pdStack_10[local_24 + -2];
        for (local_28 = 1; local_28 <= local_24 + -2; local_28 = local_28 + 1) {
          pdStack_10[local_24 + local_28 * (n + 1)] =
               pdStack_10[local_24 + -1 + (local_28 + -1) * (n + 1)] +
               pdStack_10[local_24 + -1 + (local_28 + -1) * (n + 1)] +
               -pdStack_10[local_24 + -2 + local_28 * (n + 1)];
        }
        pdStack_10[local_24 + (local_24 + -1) * (n + 1)] =
             pdStack_10[local_24 + -1 + (local_24 + -2) * (n + 1)] * 2.0;
        pdStack_10[local_24 + local_24 * (n + 1)] =
             pdStack_10[local_24 + -1 + (local_24 + -1) * (n + 1)] * 2.0;
      }
    }
  }
  return pdStack_10;
}

Assistant:

double *cheby_t_poly_coef ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    CHEBY_T_POLY_COEF evaluates coefficients of Chebyshev polynomials T(n,x).
//
//  First terms:
//
//    N/K     0     1      2      3       4     5      6    7      8    9   10
//
//     0      1
//     1      0     1
//     2     -1     0      2
//     3      0    -3      0      4
//     4      1     0     -8      0       8
//     5      0     5      0    -20       0    16
//     6     -1     0     18      0     -48     0     32
//     7      0    -7      0     56       0  -112      0    64
//
//  Recursion:
//
//    T(0,X) = 1,
//    T(1,X) = X,
//    T(N,X) = 2 * X * T(N-1,X) - T(N-2,X)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    22 April 2012
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input, int N, the highest order polynomial to compute.
//    Note that polynomials 0 through N will be computed.
//
//    Output, double CHEBY_T_POLY_COEF[(N+1)*(N+1)], the coefficients of 
//    the Chebyshev T polynomials.
//
{
  double *c;
  int i;
  int j;

  if ( n < 0 )
  {
    return NULL;
  }

  c = new double[(n+1)*(n+1)];

  for ( i = 0; i <= n; i++ )
  {
    for ( j = 0; j <= n; j++ )
    {
      c[i+j*(n+1)] = 0.0;
    }
  }

  c[0+0*(n+1)] = 1.0;

  if ( n == 0 )
  {
    return c;
  }

  c[1+1*(n+1)] = 1.0;

  for ( i = 2; i <= n; i++ )
  {
    c[i+0*(n+1)]     =                    - c[i-2+0*(n+1)];
    for ( j = 1; j <= i - 2; j++ )
    {
      c[i+j*(n+1)] = 2.0 * c[i-1+(j-1)*(n+1)] - c[i-2+j*(n+1)];
    }
    c[i+(i-1)*(n+1)] = 2.0 * c[i-1+(i-2)*(n+1)];
    c[i+ i   *(n+1)] = 2.0 * c[i-1+(i-1)*(n+1)];
  }

  return c;
}